

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

QVariant * __thiscall
Mustache::QtVariantContext::value
          (QVariant *__return_storage_ptr__,QtVariantContext *this,QString *key)

{
  QVariant *pQVar1;
  bool bVar2;
  int *piVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  QChar *pQVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  QByteArrayView QVar11;
  QStringList keyPath;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined8 local_30;
  
  pQVar7 = (QChar *)(key->d).ptr;
  if (pQVar7 == (QChar *)0x0) {
    pQVar7 = (QChar *)&QString::_empty;
  }
  iVar5 = QString::compare_helper(pQVar7,(key->d).size,".",-1,CaseSensitive);
  if ((iVar5 == 0) && (lVar9 = (this->m_contextStack).super_QList<QVariant>.d.size, lVar9 != 0)) {
    ::QVariant::QVariant
              (__return_storage_ptr__,
               (QVariant *)((this->m_contextStack).super_QList<QVariant>.d.ptr + lVar9 + -1));
  }
  else {
    QVar11.m_data = (storage_type *)0x1;
    QVar11.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar11);
    local_88 = local_40;
    uStack_84 = uStack_3c;
    uStack_80 = uStack_38;
    uStack_7c = uStack_34;
    local_78 = local_30;
    QString::split(&local_70,key,&local_88,0,1);
    piVar3 = (int *)CONCAT44(uStack_84,local_88);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),2,8);
      }
    }
    uVar6 = (int)(this->m_contextStack).super_QList<QVariant>.d.size - 1;
    if (-1 < (int)uVar6) {
      lVar8 = (ulong)uVar6 << 5;
      lVar9 = (ulong)uVar6 + 1;
      do {
        pQVar1 = (this->m_contextStack).super_QList<QVariant>.d.ptr;
        local_58.d = local_70.d;
        local_58.ptr = local_70.ptr;
        local_58.size = local_70.size;
        if (local_70.d != (Data *)0x0) {
          LOCK();
          ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        variantMapValueForKeyPath
                  (__return_storage_ptr__,(QVariant *)((long)&(pQVar1->d).data + lVar8),
                   (QStringList *)&local_58);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
        cVar4 = ::QVariant::isNull();
        if (cVar4 == '\0') goto LAB_00115fbe;
        ::QVariant::~QVariant(__return_storage_ptr__);
        lVar8 = lVar8 + -0x20;
        lVar10 = lVar9 + -1;
        bVar2 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar2);
    }
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_00115fbe:
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QtVariantContext::value(const QString& key) const
{
	if (key == "." && !m_contextStack.isEmpty()) {
		return m_contextStack.last();
	}
	QStringList keyPath = key.split(".");
	for (int i = m_contextStack.count()-1; i >= 0; i--) {
		QVariant value = variantMapValueForKeyPath(m_contextStack.at(i), keyPath);
		if (!value.isNull()) {
			return value;
		}
	}
	return QVariant();
}